

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int SaveConfigToStream(TidyDocImpl *doc,StreamOut *out)

{
  int iVar1;
  ulong uVar2;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var3;
  TidyAllocator *pTVar4;
  Bool BVar5;
  uint uVar6;
  TidyOptionValue *val_00;
  tmbstr s1;
  bool bVar7;
  tmbstr t;
  ulong dtmode;
  TidyOptionValue *val;
  TidyOptionImpl *option;
  int rc;
  StreamOut *out_local;
  TidyDocImpl *doc_local;
  
  option._4_4_ = 0;
  val = (TidyOptionValue *)(option_defs + 1);
  while( true ) {
    bVar7 = false;
    if ((option._4_4_ == 0) && (bVar7 = false, val != (TidyOptionValue *)0x0)) {
      bVar7 = val[1].v != 0;
    }
    if (!bVar7) break;
    val_00 = (doc->config).value + *(uint *)val;
    if ((val[4].v != 0) &&
       ((BVar5 = OptionValueEqDefault((TidyOptionImpl *)val,val_00), BVar5 == no ||
        (*(int *)val == 0xd)))) {
      if (*(int *)val == 0xd) {
        uVar2 = (doc->config).value[0xe].v;
        if (uVar2 == 5) {
          p_Var3 = doc->allocator->vtbl->alloc;
          pTVar4 = doc->allocator;
          uVar6 = prvTidytmbstrlen(val_00->p);
          s1 = (tmbstr)(*p_Var3)(pTVar4,(long)uVar6 + 2);
          if (s1 != (tmbstr)0x0) {
            *s1 = '\"';
            s1[1] = '\0';
            prvTidytmbstrcat(s1,val_00->p);
            prvTidytmbstrcat(s1,"\"");
            option._4_4_ = WriteOptionString((TidyOptionImpl *)val,s1,out);
            (*doc->allocator->vtbl->free)(doc->allocator,s1);
          }
        }
        else if (uVar2 != 2) {
          option._4_4_ = WriteOptionPick((TidyOptionImpl *)val,(uint)uVar2,out);
        }
      }
      else if (val[5].v == 0) {
        iVar1 = *(int *)(val + 2);
        if (iVar1 == 0) {
          option._4_4_ = WriteOptionString((TidyOptionImpl *)val,val_00->p,out);
        }
        else if (iVar1 == 1) {
          option._4_4_ = WriteOptionInt((TidyOptionImpl *)val,(uint)val_00->v,out);
        }
        else if (iVar1 == 2) {
          option._4_4_ = WriteOptionBool((TidyOptionImpl *)val,(uint)(val_00->v != 0),out);
        }
      }
      else {
        option._4_4_ = WriteOptionPick((TidyOptionImpl *)val,(uint)val_00->v,out);
      }
    }
    val = val + 7;
  }
  return option._4_4_;
}

Assistant:

static int  SaveConfigToStream( TidyDocImpl* doc, StreamOut* out )
{
    int rc = 0;
    const TidyOptionImpl* option;
    for ( option=option_defs+1; 0==rc && option && option->name; ++option )
    {
        const TidyOptionValue* val = &doc->config.value[ option->id ];
        if ( option->parser == NULL )
            continue;
        if ( OptionValueEqDefault( option, val ) && option->id != TidyDoctype)
            continue;

        if ( option->id == TidyDoctype )  /* Special case */
        {
          ulong dtmode = cfg( doc, TidyDoctypeMode );
          if ( dtmode == TidyDoctypeUser )
          {
            tmbstr t;
            
            /* add 2 double quotes */
            if (( t = (tmbstr)TidyDocAlloc( doc, TY_(tmbstrlen)( val->p ) + 2 ) ))
            {
              t[0] = '\"'; t[1] = 0;
            
              TY_(tmbstrcat)( t, val->p );
              TY_(tmbstrcat)( t, "\"" );
              rc = WriteOptionString( option, t, out );
            
              TidyDocFree( doc, t );
            }
          }
          else if ( dtmode == option_defs[TidyDoctypeMode].dflt )
            continue;
          else
            rc = WriteOptionPick( option, dtmode, out );
        }
        else if ( option->pickList)
          rc = WriteOptionPick( option, val->v, out );
        else
        {
          switch ( option->type )
          {
          case TidyString:
            rc = WriteOptionString( option, val->p, out );
            break;
          case TidyInteger:
            rc = WriteOptionInt( option, val->v, out );
            break;
          case TidyBoolean:
            rc = WriteOptionBool( option, val->v ? yes : no, out );
            break;
          }
        }
    }
    return rc;
}